

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

int CECoordinates::CIRS2Observed
              (double ra,double dec,double *az,double *zen,double julian_date,double longitude,
              double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
              double relative_humidity,double dut1,double xp,double yp,double wavelength_um,
              double *observed_ra,double *observed_dec,double *hour_angle)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  double dVar1;
  double dVar2;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  exception *e;
  CEDate date;
  int err_code;
  double temp_hour_angle;
  double temp_dec;
  double temp_ra;
  undefined8 in_stack_fffffffffffffe40;
  double in_stack_fffffffffffffe48;
  CEDate *in_stack_fffffffffffffe50;
  CEDate local_c8;
  int local_84;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_70 = 0;
  local_78 = 0;
  local_80 = 0;
  local_58 = in_RDX;
  if (in_RDX == (undefined8 *)0x0) {
    local_58 = &local_70;
  }
  local_60 = in_RCX;
  if (in_RCX == (undefined8 *)0x0) {
    local_60 = &local_78;
  }
  local_68 = in_R8;
  if (in_R8 == (undefined8 *)0x0) {
    local_68 = &local_80;
  }
  local_84 = 0;
  local_50 = in_XMM7_Qa;
  local_48 = in_XMM6_Qa;
  local_40 = in_XMM5_Qa;
  local_38 = in_XMM4_Qa;
  local_30 = in_XMM3_Qa;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  CEDate::CEDate(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (CEDateType)((ulong)in_stack_fffffffffffffe40 >> 0x20));
  dVar1 = CEDate::GetMJD2JDFactor();
  dVar2 = CEDate::MJD(&local_c8);
  local_84 = iauAtio13(local_8,local_10,dVar1,dVar2,in_stack_00000010,local_30,local_38,local_40,
                       local_18,local_20,local_68,local_60,local_58,in_R9,in_stack_00000018,
                       in_stack_00000020,local_48,local_50,in_stack_00000008,in_stack_00000028);
  CEDate::~CEDate((CEDate *)0x12f62c);
  return local_84;
}

Assistant:

int CECoordinates::CIRS2Observed(double ra, double dec,
                                 double *az, double *zen,
                                 double julian_date,
                                 double longitude,
                                 double latitude,
                                 double elevation_m,
                                 double pressure_hPa,
                                 double temperature_celsius,
                                 double relative_humidity,
                                 double dut1,
                                 double xp, double yp,
                                 double wavelength_um,
                                 double *observed_ra,
                                 double *observed_dec,
                                 double *hour_angle)
{
    // Setup the observed RA, Dec and hour_angle variables
    double temp_ra(0.0);
    double temp_dec(0.0);
    double temp_hour_angle(0.0);

    // If values were not passed, point them at the temporary ones
    if (observed_ra  == nullptr) observed_ra  = &temp_ra;
    if (observed_dec == nullptr) observed_dec = &temp_dec;
    if (hour_angle   == nullptr) hour_angle   = &temp_hour_angle;

    // Call the necessary sofa method
    int err_code = 0;
    try {
        CEDate date(julian_date, CEDateType::JD);
        err_code = iauAtio13(ra, dec,
                             CEDate::GetMJD2JDFactor(), date.MJD(),
                             dut1,
                             longitude,
                             latitude,
                             elevation_m,
                             xp, yp,
                             pressure_hPa,
                             temperature_celsius,
                             relative_humidity,
                             wavelength_um,
                             az, zen,
                             hour_angle, 
                             observed_dec, 
                             observed_ra) ;
    } catch (std::exception &e) {
        throw CEException::sofa_exception("CECoordinates::CIRS2Observed",
                                          "iauAtio13",
                                          e.what());
    }

    return err_code ;
}